

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_info.h
# Opt level: O0

void __thiscall NamesAndLabels::~NamesAndLabels(NamesAndLabels *this)

{
  NamesAndLabels *this_local;
  
  std::vector<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>::~vector(&this->labels);
  std::vector<XrDebugUtilsObjectNameInfoEXT,_std::allocator<XrDebugUtilsObjectNameInfoEXT>_>::
  ~vector(&this->objects);
  std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&this->sdk_objects);
  return;
}

Assistant:

NamesAndLabels() = default;